

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O3

bool duckdb::Varint::VarcharFormatting
               (string_t *value,idx_t *start_pos,idx_t *end_pos,bool *is_negative,bool *is_zero)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  
  if ((value->value).pointer.length == 0) {
    return false;
  }
  *start_pos = 0;
  *is_zero = false;
  uVar3 = (ulong)(value->value).pointer.length;
  if (uVar3 < 0xd) {
    pcVar5 = (value->value).pointer.prefix;
  }
  else {
    pcVar5 = (value->value).pointer.ptr;
  }
  *end_pos = uVar3;
  cVar1 = *pcVar5;
  *is_negative = cVar1 == '-';
  uVar3 = *start_pos;
  if (cVar1 == '-') {
    uVar3 = uVar3 + 1;
    *start_pos = uVar3;
  }
  if (*pcVar5 == '+') {
    uVar3 = uVar3 + 1;
    *start_pos = uVar3;
  }
  uVar6 = *end_pos;
  if (uVar3 < uVar6) {
    cVar1 = pcVar5[uVar3];
    cVar2 = cVar1;
    while (cVar2 == '0') {
      uVar3 = uVar3 + 1;
      *start_pos = uVar3;
      uVar6 = *end_pos;
      if (uVar6 <= uVar3) break;
      cVar2 = pcVar5[uVar3];
    }
    if (uVar3 == uVar6) {
      if (cVar1 == '0') {
        *is_zero = true;
        return true;
      }
      return false;
    }
  }
  else if (uVar3 == uVar6) {
    return false;
  }
  if (uVar6 <= uVar3) {
    return true;
  }
  do {
    if (9 < (int)pcVar5[uVar3] - 0x30U) {
      uVar4 = uVar3;
      if (pcVar5[uVar3] != '.') {
        return false;
      }
      do {
        uVar4 = uVar4 + 1;
        if (uVar6 <= uVar4) {
          *end_pos = uVar3;
          return true;
        }
      } while ((int)pcVar5[uVar4] - 0x30U < 10);
      return false;
    }
    uVar3 = uVar3 + 1;
  } while (uVar6 != uVar3);
  return true;
}

Assistant:

bool Empty() const {
		return value.inlined.length == 0;
	}